

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_interface.cpp
# Opt level: O0

MachineConfiguration * MT32Emu::findMachineConfiguration(char *machine_id)

{
  int iVar1;
  MachineConfiguration **ppMVar2;
  char *__s1;
  uint local_2c;
  Bit32u i;
  MachineConfiguration **configurations;
  char *pcStack_18;
  Bit32u configurationCount;
  char *machine_id_local;
  
  pcStack_18 = machine_id;
  ppMVar2 = MachineConfiguration::getAllMachineConfigurations((Bit32u *)((long)&configurations + 4))
  ;
  local_2c = 0;
  while( true ) {
    if (configurations._4_4_ <= local_2c) {
      return (MachineConfiguration *)0x0;
    }
    __s1 = MachineConfiguration::getMachineID(ppMVar2[local_2c]);
    iVar1 = strcmp(__s1,pcStack_18);
    if (iVar1 == 0) break;
    local_2c = local_2c + 1;
  }
  return ppMVar2[local_2c];
}

Assistant:

static const MachineConfiguration *findMachineConfiguration(const char *machine_id) {
	Bit32u configurationCount;
	const MachineConfiguration * const *configurations = MachineConfiguration::getAllMachineConfigurations(&configurationCount);
	for (Bit32u i = 0; i < configurationCount; i++) {
		if (!strcmp(configurations[i]->getMachineID(), machine_id)) return configurations[i];
	}
	return NULL;
}